

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

void __thiscall
lf::uscalfe::
ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>_>
::ReactionDiffusionElementMatrixProvider
          (ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
           *this,shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
          *alpha,MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
                 *gamma)

{
  RefEl ref_el_00;
  int iVar1;
  uint uVar2;
  element_type *this_00;
  ScalarReferenceFiniteElement<double> *fe_00;
  reference this_01;
  QuadRule local_120;
  PrecomputedScalarReferenceFiniteElement<double> local_f0;
  RefElType local_79;
  ScalarReferenceFiniteElement<double> *local_78;
  ScalarReferenceFiniteElement<double> *fe;
  const_iterator pRStack_68;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_50;
  initializer_list<lf::base::RefEl> *local_40;
  initializer_list<lf::base::RefEl> *__range2;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
  *local_28;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
  *gamma_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
  *alpha_local;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  ReactionDiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>_>
  *this_local;
  
  this->_vptr_ReactionDiffusionElementMatrixProvider = (_func_int **)&PTR_isActive_00be11d8;
  local_28 = gamma;
  gamma_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:106:7)>
                 *)alpha;
  alpha_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:101:48)>
                 *)fe_space;
  fe_space_local = (shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> *)this;
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:101:48)>
  ::MeshFunctionGlobal(&this->alpha_,alpha);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:106:7)>
  ::MeshFunctionGlobal(&this->gamma_,gamma);
  memset(&this->fe_precomp_,0,0x230);
  std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::array
            (&this->fe_precomp_);
  __begin2._6_1_ = lf::base::RefEl::kTria();
  __begin2._7_1_ = lf::base::RefEl::kQuad();
  local_50._M_array = (iterator)((long)&__begin2 + 6);
  local_50._M_len = 2;
  local_40 = &local_50;
  __end2 = std::initializer_list<lf::base::RefEl>::begin(local_40);
  pRStack_68 = std::initializer_list<lf::base::RefEl>::end(local_40);
  for (; __end2 != pRStack_68; __end2 = __end2 + 1) {
    fe._7_1_ = (RefEl)__end2->type_;
    this_00 = std::
              __shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)fe_space);
    local_79 = fe._7_1_;
    fe_00 = UniformScalarFESpace<double>::ShapeFunctionLayout(this_00,fe._7_1_);
    ref_el_00.type_ = fe._7_1_;
    local_78 = fe_00;
    if (fe_00 != (ScalarReferenceFiniteElement<double> *)0x0) {
      iVar1 = (*fe_00->_vptr_ScalarReferenceFiniteElement[3])();
      quad::make_QuadRule(&local_120,ref_el_00,iVar1 * 2);
      PrecomputedScalarReferenceFiniteElement<double>::PrecomputedScalarReferenceFiniteElement
                (&local_f0,fe_00,&local_120);
      uVar2 = lf::base::RefEl::Id((RefEl *)((long)&fe + 7));
      this_01 = std::array<lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>,_5UL>::
                operator[](&this->fe_precomp_,(ulong)uVar2);
      PrecomputedScalarReferenceFiniteElement<double>::operator=(this_01,&local_f0);
      PrecomputedScalarReferenceFiniteElement<double>::~PrecomputedScalarReferenceFiniteElement
                (&local_f0);
      quad::QuadRule::~QuadRule(&local_120);
    }
  }
  return;
}

Assistant:

ReactionDiffusionElementMatrixProvider<SCALAR, DIFF_COEFF, REACTION_COEFF>::
    ReactionDiffusionElementMatrixProvider(
        std::shared_ptr<const UniformScalarFESpace<SCALAR>> fe_space,
        DIFF_COEFF alpha, REACTION_COEFF gamma)
    : alpha_(std::move(alpha)), gamma_(std::move(gamma)), fe_precomp_() {
  for (auto ref_el : {base::RefEl::kTria(), base::RefEl::kQuad()}) {
    auto fe = fe_space->ShapeFunctionLayout(ref_el);
    // Check whether shape functions for that entity type are available.
    // Note that the corresponding PrecomputedScalarReferenceFiniteElement local
    // object is not initialized if the associated description of local shape
    // functions is missing.
    if (fe != nullptr) {
      // Precompute cell-independent quantities based on quadrature rules
      // with twice the degree of exactness compared to the degree of the
      // finite element space.
      fe_precomp_[ref_el.Id()] = PrecomputedScalarReferenceFiniteElement(
          fe, quad::make_QuadRule(ref_el, 2 * fe->Degree()));
    }
  }
}